

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

UBool __thiscall
icu_63::MessagePattern::copyStorage
          (MessagePattern *this,MessagePattern *other,UErrorCode *errorCode)

{
  MessagePatternPartsList *__s;
  MessagePatternDoubleList *pMVar1;
  MessagePattern *other_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValues = (double *)0x0;
  this->numericValuesLength = 0;
  other_00 = other;
  if (this->partsList == (MessagePatternPartsList *)0x0) {
    __s = (MessagePatternPartsList *)UMemory::operator_new((UMemory *)0x210,(size_t)other);
    if (__s == (MessagePatternPartsList *)0x0) {
      __s = (MessagePatternPartsList *)0x0;
    }
    else {
      other_00 = (MessagePattern *)0x0;
      memset(__s,0,0x210);
      (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr =
           (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.stackArray;
      (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.capacity = 0x20;
      (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.needToRelease = '\0';
    }
    this->partsList = __s;
    if (__s != (MessagePatternPartsList *)0x0) {
      this->parts = (__s->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr;
      goto LAB_00289528;
    }
LAB_002895ed:
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
LAB_00289528:
    if (0 < other->partsLength) {
      other_00 = (MessagePattern *)other->partsList;
      MessagePatternList<icu_63::MessagePattern::Part,_32>::copyFrom
                (&this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>,
                 (MessagePatternList<icu_63::MessagePattern::Part,_32> *)other_00,other->partsLength
                 ,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return '\0';
      }
      this->parts = (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                    ptr;
      this->partsLength = other->partsLength;
    }
    if (other->numericValuesLength < 1) {
      return '\x01';
    }
    if (this->numericValuesList == (MessagePatternDoubleList *)0x0) {
      pMVar1 = (MessagePatternDoubleList *)UMemory::operator_new((UMemory *)0x50,(size_t)other_00);
      if (pMVar1 == (MessagePatternDoubleList *)0x0) {
        pMVar1 = (MessagePatternDoubleList *)0x0;
      }
      else {
        (pMVar1->super_MessagePatternList<double,_8>).a.ptr = (double *)0x0;
        (pMVar1->super_MessagePatternList<double,_8>).a.capacity = 0;
        (pMVar1->super_MessagePatternList<double,_8>).a.needToRelease = '\0';
        *(undefined3 *)&(pMVar1->super_MessagePatternList<double,_8>).a.field_0xd = 0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[6] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[7] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[4] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[5] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[2] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[3] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[0] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.stackArray[1] = 0.0;
        (pMVar1->super_MessagePatternList<double,_8>).a.ptr =
             (pMVar1->super_MessagePatternList<double,_8>).a.stackArray;
        (pMVar1->super_MessagePatternList<double,_8>).a.capacity = 8;
        (pMVar1->super_MessagePatternList<double,_8>).a.needToRelease = '\0';
      }
      this->numericValuesList = pMVar1;
      if (pMVar1 == (MessagePatternDoubleList *)0x0) goto LAB_002895ed;
      this->numericValues = (pMVar1->super_MessagePatternList<double,_8>).a.ptr;
    }
    MessagePatternList<double,_8>::copyFrom
              (&this->numericValuesList->super_MessagePatternList<double,_8>,
               &other->numericValuesList->super_MessagePatternList<double,_8>,
               other->numericValuesLength,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      this->numericValues = (this->numericValuesList->super_MessagePatternList<double,_8>).a.ptr;
      this->numericValuesLength = other->numericValuesLength;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool
MessagePattern::copyStorage(const MessagePattern &other, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    parts=NULL;
    partsLength=0;
    numericValues=NULL;
    numericValuesLength=0;
    if(partsList==NULL) {
        partsList=new MessagePatternPartsList();
        if(partsList==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        parts=partsList->a.getAlias();
    }
    if(other.partsLength>0) {
        partsList->copyFrom(*other.partsList, other.partsLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        parts=partsList->a.getAlias();
        partsLength=other.partsLength;
    }
    if(other.numericValuesLength>0) {
        if(numericValuesList==NULL) {
            numericValuesList=new MessagePatternDoubleList();
            if(numericValuesList==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return FALSE;
            }
            numericValues=numericValuesList->a.getAlias();
        }
        numericValuesList->copyFrom(
            *other.numericValuesList, other.numericValuesLength, errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        numericValues=numericValuesList->a.getAlias();
        numericValuesLength=other.numericValuesLength;
    }
    return TRUE;
}